

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.hh
# Opt level: O2

shared_ptr<const_tchecker::parsing::clock_declaration_t> __thiscall
tchecker::parsing::system_declaration_t::get_declaration<tchecker::parsing::clock_declaration_t>
          (system_declaration_t *this,string *name,
          declaration_map_t<tchecker::parsing::clock_declaration_t> *m)

{
  const_iterator cVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<const_tchecker::parsing::clock_declaration_t> sVar3;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(in_RCX,(key_type *)m);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->super_declaration_t)._vptr_declaration_t = (_func_int **)0x0;
    (this->super_declaration_t)._attr._attr._M_h._M_buckets = (__buckets_ptr)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<tchecker::parsing::clock_declaration_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::parsing::clock_declaration_t,void>
              ((__shared_ptr<tchecker::parsing::clock_declaration_t_const,(__gnu_cxx::_Lock_policy)2>
                *)this,(__shared_ptr<tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        *)((long)cVar1.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
                                 ._M_cur + 0x28));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::parsing::clock_declaration_t>)
         sVar3.
         super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<T const> get_declaration(std::string const & name, declaration_map_t<T> const & m) const
  {
    auto it = m.find(name);
    if (it == m.end())
      return nullptr;
    return it->second;
  }